

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O3

CheckStreamRez * __thiscall
H264StreamReader::checkStream
          (CheckStreamRez *__return_storage_ptr__,H264StreamReader *this,uint8_t *buffer,int len)

{
  _Rb_tree_header *p_Var1;
  byte bVar2;
  int iVar3;
  byte *buffer_00;
  uint8_t *puVar4;
  SPSUnit *extraout_RAX;
  long *plVar5;
  SPSUnit *pSVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  uint uVar9;
  _Base_ptr p_Var8;
  _Base_ptr p_Var10;
  _Rb_tree_header *p_Var11;
  ulong uVar12;
  uint8_t *puVar13;
  bool bVar14;
  string tmpDescr;
  uint8_t tmpBuffer [512];
  SliceUnit slice;
  SEIUnit lastSEI;
  undefined1 *local_4e0;
  long local_4d8;
  undefined1 local_4d0;
  undefined7 uStack_4cf;
  _Rb_tree_header *local_4c0;
  ulong local_4b8;
  ulong local_4b0;
  string *local_4a8;
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,PPSUnit*>,std::_Select1st<std::pair<unsigned_int_const,PPSUnit*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,PPSUnit*>>>
  *local_4a0;
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,SPSUnit*>,std::_Select1st<std::pair<unsigned_int_const,SPSUnit*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,SPSUnit*>>>
  *local_498;
  string *local_490;
  string *local_488;
  byte *local_480;
  string local_478;
  undefined1 local_458 [520];
  SliceUnit local_250;
  SEIUnit local_1d0;
  
  local_1d0.m_processedMessages._M_h._M_buckets =
       &local_1d0.m_processedMessages._M_h._M_single_bucket;
  local_1d0.super_NALUnit.bitReader.super_BitStream.m_totalBits = 0;
  local_1d0.super_NALUnit.bitReader.super_BitStream.m_buffer = (uint *)0x0;
  local_1d0.super_NALUnit.bitReader.super_BitStream.m_initBuffer = (uint *)0x0;
  local_1d0.super_NALUnit.bitReader.m_curVal = 0;
  local_1d0.super_NALUnit.bitReader.m_bitLeft = 0;
  local_1d0.super_NALUnit.nal_unit_type = nuUnspecified;
  local_1d0.super_NALUnit.nal_ref_idc = 0;
  local_1d0.super_NALUnit.m_nalBuffer = (uint8_t *)0x0;
  local_1d0.super_NALUnit.m_nalBufferLen = 0;
  local_1d0.super_NALUnit._vptr_NALUnit = (_func_int **)&PTR__SEIUnit_0023d5a0;
  local_1d0.pic_struct = '\0';
  local_1d0.m_processedMessages._M_h._M_bucket_count = 1;
  local_1d0.m_processedMessages._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1d0.m_processedMessages._M_h._M_element_count = 0;
  local_1d0.m_processedMessages._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  memset(&local_1d0.m_processedMessages._M_h._M_rehash_policy._M_next_resize,0,0x118);
  local_1d0.number_of_offset_sequences = -1;
  local_1d0.metadataPtsOffset = 0;
  local_1d0.m_mvcHeaderLen = 0;
  local_1d0.m_mvcHeaderStart = (uint8_t *)0x0;
  SliceUnit::SliceUnit(&local_250);
  (__return_storage_ptr__->codecInfo).codecID = 0;
  (__return_storage_ptr__->codecInfo).displayName._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->codecInfo).displayName.field_2;
  (__return_storage_ptr__->codecInfo).displayName._M_string_length = 0;
  (__return_storage_ptr__->codecInfo).displayName.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->codecInfo).programName._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->codecInfo).programName.field_2;
  (__return_storage_ptr__->codecInfo).programName._M_string_length = 0;
  (__return_storage_ptr__->codecInfo).programName.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->streamDescr)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->streamDescr).field_2;
  (__return_storage_ptr__->streamDescr)._M_string_length = 0;
  (__return_storage_ptr__->streamDescr).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->lang)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->lang).field_2
  ;
  (__return_storage_ptr__->lang)._M_string_length = 0;
  (__return_storage_ptr__->lang).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->trackID = 0;
  *(undefined4 *)((long)&__return_storage_ptr__->delay + 7) = 0;
  __return_storage_ptr__->delay = 0;
  puVar13 = buffer + len;
  local_4e0 = &local_4d0;
  local_4d8 = 0;
  local_4d0 = 0;
  buffer_00 = NALUnit::findNextNAL(buffer,puVar13);
  local_4a8 = (string *)&(__return_storage_ptr__->codecInfo).displayName;
  local_488 = (string *)&(__return_storage_ptr__->codecInfo).programName;
  local_490 = (string *)&__return_storage_ptr__->streamDescr;
  local_480 = puVar13 + -4;
  p_Var1 = &(this->m_spsMap)._M_t._M_impl.super__Rb_tree_header;
  local_4a0 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,PPSUnit*>,std::_Select1st<std::pair<unsigned_int_const,PPSUnit*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,PPSUnit*>>>
               *)&this->m_ppsMap;
  local_4c0 = &(this->m_ppsMap)._M_t._M_impl.super__Rb_tree_header;
  local_498 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,SPSUnit*>,std::_Select1st<std::pair<unsigned_int_const,SPSUnit*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,SPSUnit*>>>
               *)&this->m_spsMap;
  local_4b8 = 0;
  local_4b0 = 0;
  for (; buffer_00 < local_480; buffer_00 = NALUnit::findNextNAL(buffer_00,puVar13)) {
    bVar2 = *buffer_00;
    if ((char)bVar2 < '\0') goto LAB_00184665;
    puVar4 = NALUnit::findNALWithStartCode(buffer_00,puVar13,true);
    if ((puVar4 == puVar13) && ((this->super_MPEGStreamReader).m_eof == false)) break;
    switch(bVar2 & 0x1f) {
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 0x14:
      if (((this->m_ppsMap)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
         ((this->m_spsMap)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
        uVar12 = (long)puVar4 - (long)buffer_00;
        if (0x1f7 < uVar12) {
          uVar12 = 0x1f8;
        }
        iVar3 = NALUnit::decodeNAL(buffer_00,buffer_00 + uVar12,local_458,0x200);
        iVar3 = SliceUnit::deserialize
                          (&local_250,local_458,local_458 + iVar3,
                           (map<unsigned_int,_SPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SPSUnit_*>_>_>
                            *)local_498,
                           (map<unsigned_int,_PPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_PPSUnit_*>_>_>
                            *)local_4a0);
        if (iVar3 != 0) goto LAB_00184665;
        if (this->m_mvcSubStream == true) {
          (__return_storage_ptr__->codecInfo).codecID = ::h264DepCodecInfo.codecID;
          std::__cxx11::string::_M_assign(local_4a8);
        }
        else {
          (__return_storage_ptr__->codecInfo).codecID = ::h264CodecInfo.codecID;
          std::__cxx11::string::_M_assign(local_4a8);
        }
        std::__cxx11::string::_M_assign(local_488);
        std::__cxx11::string::_M_assign(local_490);
      }
      break;
    case 6:
      if ((this->m_spsMap)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        pSVar6 = (SPSUnit *)
                 (this->m_spsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent;
        NALUnit::decodeBuffer(&local_1d0.super_NALUnit,buffer_00,puVar4);
        uVar9 = 1;
        if ((pSVar6->nalHrdParams).isPresent == false) {
          uVar9 = (uint)(pSVar6->vclHrdParams).isPresent;
        }
        SEIUnit::deserialize(&local_1d0,pSVar6,uVar9);
        if (0xfb < (byte)(local_1d0.pic_struct - 9U) && (local_4b0 & 1) == 0) {
          SPSUnit::getStreamDescr_abi_cxx11_((string *)local_458,pSVar6);
          std::__cxx11::string::operator=((string *)&local_4e0,(string *)local_458);
          pSVar6 = (SPSUnit *)(local_458 + 0x10);
          if ((SPSUnit *)local_458._0_8_ != pSVar6) {
            operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
            pSVar6 = extraout_RAX;
          }
          local_4b0 = CONCAT71((int7)((ulong)pSVar6 >> 8),1);
          std::__cxx11::string::append((char *)&local_4e0);
        }
        if (-1 < local_1d0.number_of_offset_sequences && (local_4b8 & 1) == 0) {
          int32ToStr_abi_cxx11_(&local_478,&local_1d0.number_of_offset_sequences);
          plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_478,0,(char *)0x0,0x2054ac);
          local_458._0_8_ = local_458 + 0x10;
          pSVar6 = (SPSUnit *)(plVar5 + 2);
          if ((SPSUnit *)*plVar5 == pSVar6) {
            local_458._16_8_ = (pSVar6->super_NALUnit)._vptr_NALUnit;
            local_458._24_8_ = plVar5[3];
          }
          else {
            local_458._16_8_ = (pSVar6->super_NALUnit)._vptr_NALUnit;
            local_458._0_8_ = (SPSUnit *)*plVar5;
          }
          local_458._8_8_ = plVar5[1];
          *plVar5 = (long)pSVar6;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_4e0,local_458._0_8_);
          if ((SPSUnit *)local_458._0_8_ != (SPSUnit *)(local_458 + 0x10)) {
            operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
          }
          paVar7 = &local_478.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_478._M_dataplus._M_p != paVar7) {
            operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
            paVar7 = extraout_RAX_00;
          }
          local_4b8 = CONCAT71((int7)((ulong)paVar7 >> 8),1);
        }
      }
      break;
    case 7:
      this->m_mvcPrimaryStream = true;
      goto LAB_0018435d;
    case 8:
      pSVar6 = (SPSUnit *)operator_new(0x58);
      (pSVar6->super_NALUnit).bitReader.super_BitStream.m_totalBits = 0;
      (pSVar6->super_NALUnit).bitReader.super_BitStream.m_buffer = (uint *)0x0;
      (pSVar6->super_NALUnit).bitReader.super_BitStream.m_initBuffer = (uint *)0x0;
      (pSVar6->super_NALUnit).bitReader.m_curVal = 0;
      (pSVar6->super_NALUnit).bitReader.m_bitLeft = 0;
      (pSVar6->super_NALUnit).nal_unit_type = nuUnspecified;
      (pSVar6->super_NALUnit).nal_ref_idc = 0;
      (pSVar6->super_NALUnit).m_nalBuffer = (uint8_t *)0x0;
      (pSVar6->super_NALUnit).m_nalBufferLen = 0;
      (pSVar6->super_NALUnit)._vptr_NALUnit = (_func_int **)&PTR__NALUnit_0023d550;
      pSVar6->m_ready = false;
      pSVar6->field_0x41 = 0;
      pSVar6->sar_width = 0;
      pSVar6->sar_height = 0;
      *(undefined2 *)&pSVar6->field_0x46 = 0;
      pSVar6->num_units_in_tick = 1;
      pSVar6->time_scale = 1;
      *(undefined1 *)&pSVar6->fixed_frame_rate_flag = 0;
      NALUnit::decodeBuffer((NALUnit *)pSVar6,buffer_00,puVar4);
      iVar3 = PPSUnit::deserialize((PPSUnit *)pSVar6);
      if (iVar3 != 0) {
        (pSVar6->super_NALUnit)._vptr_NALUnit = (_func_int **)&PTR__NALUnit_0023f088;
        puVar13 = (pSVar6->super_NALUnit).m_nalBuffer;
        if (puVar13 != (uint8_t *)0x0) {
          operator_delete__(puVar13);
        }
        uVar12 = 0x58;
        goto LAB_0018465d;
      }
      p_Var8 = (this->m_spsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var8 != (_Base_ptr)0x0) {
        uVar9 = *(uint *)&pSVar6->sar_height;
        p_Var10 = &p_Var1->_M_header;
        do {
          bVar14 = (uint)*(size_t *)(p_Var8 + 1) < uVar9;
          if (!bVar14) {
            p_Var10 = p_Var8;
          }
          p_Var8 = (&p_Var8->_M_left)[bVar14];
        } while (p_Var8 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var10 != p_Var1) &&
           ((uint)((_Rb_tree_header *)p_Var10)->_M_node_count <= uVar9)) {
          p_Var8 = (this->m_ppsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          uVar9._0_1_ = pSVar6->m_ready;
          uVar9._1_1_ = pSVar6->field_0x41;
          uVar9._2_2_ = pSVar6->sar_width;
          p_Var11 = local_4c0;
          if (p_Var8 != (_Base_ptr)0x0) {
            do {
              bVar14 = (uint)*(size_t *)(p_Var8 + 1) < uVar9;
              if (!bVar14) {
                p_Var11 = (_Rb_tree_header *)p_Var8;
              }
              p_Var8 = (&p_Var8->_M_left)[bVar14];
            } while (p_Var8 != (_Base_ptr)0x0);
            if ((p_Var11 != local_4c0) && ((uint)p_Var11->_M_node_count <= uVar9))
            goto LAB_001844e3;
          }
          local_458._0_4_ = uVar9;
          local_458._8_8_ = pSVar6;
          std::
          _Rb_tree<unsigned_int,std::pair<unsigned_int_const,PPSUnit*>,std::_Select1st<std::pair<unsigned_int_const,PPSUnit*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,PPSUnit*>>>
          ::_M_emplace_unique<std::pair<unsigned_int,PPSUnit*>>
                    (local_4a0,(pair<unsigned_int,_PPSUnit_*> *)local_458);
          break;
        }
      }
LAB_001844e3:
      (pSVar6->super_NALUnit)._vptr_NALUnit = (_func_int **)&PTR__NALUnit_0023f088;
      puVar4 = (pSVar6->super_NALUnit).m_nalBuffer;
      if (puVar4 != (uint8_t *)0x0) {
        operator_delete__(puVar4);
      }
      uVar12 = 0x58;
      goto LAB_00184511;
    case 0xf:
      this->m_mvcSubStream = true;
LAB_0018435d:
      pSVar6 = (SPSUnit *)operator_new(0x200);
      SPSUnit::SPSUnit(pSVar6);
      NALUnit::decodeBuffer((NALUnit *)pSVar6,buffer_00,puVar4);
      iVar3 = SPSUnit::deserialize(pSVar6);
      if (iVar3 != 0) {
        SPSUnit::~SPSUnit(pSVar6);
        uVar12 = 0x200;
LAB_0018465d:
        operator_delete(pSVar6,uVar12);
        goto LAB_00184665;
      }
      p_Var8 = (this->m_spsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      uVar9 = pSVar6->seq_parameter_set_id;
      p_Var10 = &p_Var1->_M_header;
      if (p_Var8 == (_Base_ptr)0x0) {
LAB_001843cf:
        local_458._0_4_ = uVar9;
        local_458._8_8_ = pSVar6;
        std::
        _Rb_tree<unsigned_int,std::pair<unsigned_int_const,SPSUnit*>,std::_Select1st<std::pair<unsigned_int_const,SPSUnit*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,SPSUnit*>>>
        ::_M_emplace_unique<std::pair<unsigned_int,SPSUnit*>>
                  (local_498,(pair<unsigned_int,_SPSUnit_*> *)local_458);
        if (local_4d8 == 0) {
          SPSUnit::getStreamDescr_abi_cxx11_((string *)local_458,pSVar6);
          std::__cxx11::string::operator=((string *)&local_4e0,(string *)local_458);
          if ((SPSUnit *)local_458._0_8_ != (SPSUnit *)(local_458 + 0x10)) {
            uVar12 = local_458._16_8_ + 1;
            pSVar6 = (SPSUnit *)local_458._0_8_;
            goto LAB_00184511;
          }
        }
      }
      else {
        do {
          bVar14 = (uint)*(size_t *)(p_Var8 + 1) < uVar9;
          if (!bVar14) {
            p_Var10 = p_Var8;
          }
          p_Var8 = (&p_Var8->_M_left)[bVar14];
        } while (p_Var8 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var10 == p_Var1) ||
           (uVar9 < (uint)((_Rb_tree_header *)p_Var10)->_M_node_count)) goto LAB_001843cf;
        SPSUnit::~SPSUnit(pSVar6);
        uVar12 = 0x200;
LAB_00184511:
        operator_delete(pSVar6,uVar12);
      }
    }
  }
  if ((this->m_mvcSubStream == true) && (this->m_mvcPrimaryStream == true)) {
    __return_storage_ptr__->multiSubStream = true;
  }
LAB_00184665:
  if (local_4e0 != &local_4d0) {
    operator_delete(local_4e0,CONCAT71(uStack_4cf,local_4d0) + 1);
  }
  local_250.super_NALUnit._vptr_NALUnit = (_func_int **)&PTR__NALUnit_0023f088;
  if (local_250.super_NALUnit.m_nalBuffer != (uint8_t *)0x0) {
    operator_delete__(local_250.super_NALUnit.m_nalBuffer);
  }
  SEIUnit::~SEIUnit(&local_1d0);
  return __return_storage_ptr__;
}

Assistant:

CheckStreamRez H264StreamReader::checkStream(uint8_t *buffer, int len)
{
    SEIUnit lastSEI;
    SliceUnit slice;
    CheckStreamRez rez;
    uint8_t *end = buffer + len;
    std::string tmpDescr;
    bool pulldownInserted = false;
    bool offsetsInserted = false;

    for (uint8_t *nal = NALUnit::findNextNAL(buffer, end); nal < end - 4; nal = NALUnit::findNextNAL(nal, end))
    {
        if (*nal & 0x80)
            return rez;
        auto nalType = static_cast<NALUnit::NALType>(*nal & 0x1f);
        const uint8_t *nextNal = NALUnit::findNALWithStartCode(nal, end, true);
        if (!m_eof && nextNal == end)
            break;

        switch (nalType)
        {
        case NALUnit::NALType::nuSubSPS:
            m_mvcSubStream = true;
            [[fallthrough]];
        case NALUnit::NALType::nuSPS:
        {
            if (nalType == NALUnit::NALType::nuSPS)
                m_mvcPrimaryStream = true;
            auto sps = new SPSUnit();
            sps->decodeBuffer(nal, nextNal);
            if (sps->deserialize() != 0)
            {
                delete sps;
                return rez;
            }
            if (m_spsMap.find(sps->seq_parameter_set_id) != m_spsMap.end())
            {
                delete sps;
                break;
            }
            m_spsMap.insert(make_pair(sps->seq_parameter_set_id, sps));
            if (tmpDescr.empty())
                tmpDescr = sps->getStreamDescr();
            break;
        }
        case NALUnit::NALType::nuPPS:
        {
            auto pps = new PPSUnit();
            pps->decodeBuffer(nal, nextNal);
            if (pps->deserialize() != 0)
            {
                delete pps;
                return rez;
            }
            if (m_spsMap.find(pps->seq_parameter_set_id) == m_spsMap.end() ||
                m_ppsMap.find(pps->pic_parameter_set_id) != m_ppsMap.end())
            {
                delete pps;
                break;
            }
            m_ppsMap.insert(make_pair(pps->pic_parameter_set_id, pps));
            break;
        }
        case NALUnit::NALType::nuSEI:
            if (!m_spsMap.empty())
            {
                SPSUnit *sps = m_spsMap.begin()->second;
                lastSEI.decodeBuffer(nal, nextNal);
                lastSEI.deserialize(*sps, sps->nalHrdParams.isPresent || sps->vclHrdParams.isPresent);
                if (lastSEI.pic_struct == 5 || lastSEI.pic_struct == 6 || lastSEI.pic_struct == 7 ||
                    lastSEI.pic_struct == 8)
                {
                    if (!pulldownInserted)
                    {
                        pulldownInserted = true;
                        tmpDescr = sps->getStreamDescr();
                        tmpDescr += " (pulldown)";
                    }
                }
                if (!offsetsInserted && lastSEI.number_of_offset_sequences >= 0)
                {
                    offsetsInserted = true;
                    tmpDescr += "  3d-pg-planes: " + int32ToStr(lastSEI.number_of_offset_sequences);
                }
            }
            break;

        case NALUnit::NALType::nuSliceIDR:
            // m_openGOP = false;
        case NALUnit::NALType::nuSliceNonIDR:
        case NALUnit::NALType::nuSliceA:
        case NALUnit::NALType::nuSliceB:
        case NALUnit::NALType::nuSliceC:
        case NALUnit::NALType::nuSliceExt:
            if (m_ppsMap.empty() || m_spsMap.empty())
                break;
            try
            {
                uint8_t tmpBuffer[512];
                int toDecode = static_cast<int>(FFMIN(sizeof(tmpBuffer) - 8, nextNal - nal));
                int decodedLen = SliceUnit::decodeNAL(nal, nal + toDecode, tmpBuffer, sizeof(tmpBuffer));
                int nalRez = slice.deserialize(tmpBuffer, tmpBuffer + decodedLen, m_spsMap, m_ppsMap);
                if (nalRez != 0)
                    return rez;

                if (m_mvcSubStream)
                    rez.codecInfo = h264DepCodecInfo;
                else
                    rez.codecInfo = h264CodecInfo;
                rez.streamDescr = tmpDescr;
            }
            catch (BitStreamException &e)
            {
                (void)e;
                return rez;
            }
            break;
        default:
            break;
        }
    }
    if (m_mvcSubStream && m_mvcPrimaryStream)
        rez.multiSubStream = true;

    return rez;
}